

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer *ppbVar1;
  ulong uVar2;
  pointer pbVar3;
  TestInfo *pTVar4;
  InternalRunDeathTestFlag *pIVar5;
  _union_1457 _Var6;
  _func_void *p_Var7;
  size_type *psVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  int *piVar14;
  void *__addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  pointer extraout_RDX_00;
  pointer pcVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  pointer extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  pointer ppcVar20;
  ulong uVar21;
  pointer pbVar22;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar23;
  undefined8 uVar24;
  const_iterator __position;
  size_t __len;
  _union_1457 local_310;
  sigaction ignore_sigprof_action;
  string filter_flag;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  size_type *local_238;
  string internal_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  undefined1 local_180 [8];
  ExecDeathTestArgs args_2;
  int local_15c;
  undefined1 auStack_158 [4];
  int death_test_index;
  Arguments args;
  int local_138;
  int local_134;
  int pipe_fd [2];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  UnitTest::GetInstance();
  pTVar4 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  pIVar5 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  local_15c = (pTVar4->result_).death_test_count_;
  if (pIVar5 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar5->write_fd_;
    return EXECUTE_TEST;
  }
  iVar10 = pipe(&local_138);
  if (iVar10 == -1) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_70,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                    );
    local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar17) {
      local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    local_50._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_50,", line ");
    local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar17) {
      local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p._0_4_ = 0x46b;
    StreamableToString<int>(&local_d0,(int *)&local_110);
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar24 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_d0._M_string_length + local_90._M_string_length) {
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar24 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_d0._M_string_length + local_90._M_string_length) goto LAB_001460da;
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_d0,0,0,local_90._M_dataplus._M_p,local_90._M_string_length);
    }
    else {
LAB_001460da:
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_90,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    }
    local_b0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar17) {
      local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    local_b0._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    paVar17->_M_local_buf[0] = '\0';
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_b0,": ");
    local_310.sa_handler = (__sighandler_t)(pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.sa_handler == paVar17) {
      ignore_sigprof_action.sa_mask.__val[0] = paVar17->_M_allocated_capacity;
      ignore_sigprof_action.sa_mask.__val[1] = *(unsigned_long *)((long)&pbVar13->field_2 + 8);
      local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = paVar17->_M_allocated_capacity;
    }
    ignore_sigprof_action.__sigaction_handler =
         (anon_union_8_2_5ad2d23e_for___sigaction_handler)pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_310
                     ,"pipe(pipe_fd) != -1");
    internal_flag.field_2._8_8_ = (pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)internal_flag.field_2._8_8_ == paVar17) {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar17->_M_allocated_capacity;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&pbVar13->field_2 + 8)
      ;
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar17->_M_allocated_capacity;
    }
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
    pbVar13 = extraout_RAX_02;
    internal_flag.field_2._8_8_ = extraout_RDX_02;
LAB_00146ad9:
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar17->_M_allocated_capacity;
  }
  else {
    iVar10 = fcntl(local_134,2,0);
    if (iVar10 != -1) {
      paVar17 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar17;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"--","");
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_70,"gtest_");
      paVar18 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar15) {
        local_50.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_50._M_dataplus._M_p = (pointer)paVar18;
      }
      else {
        local_50.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_50._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_50,"filter");
      local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar15) {
        local_90.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_90._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_90,"=");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar13->_M_dataplus)._M_p;
      paVar16 = &pbVar13->field_2;
      if (paVar15 == paVar16) {
        local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_b0._M_dataplus._M_p = (pointer)paVar15;
      }
      local_b0._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_b0,(pTVar4->test_case_name_)._M_dataplus._M_p);
      local_310.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      _Var6.sa_handler = (__sighandler_t)(pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6.sa_handler == paVar15) {
        ignore_sigprof_action.sa_mask.__val[0] = paVar15->_M_allocated_capacity;
        ignore_sigprof_action.sa_mask.__val[1] = *(unsigned_long *)((long)&pbVar13->field_2 + 8);
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = paVar15->_M_allocated_capacity;
        local_310.sa_handler = _Var6.sa_handler;
      }
      ignore_sigprof_action.__sigaction_handler =
           (anon_union_8_2_5ad2d23e_for___sigaction_handler)pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_310,".");
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      pcVar19 = (pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar19 == paVar15) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar15->_M_allocated_capacity;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)&pbVar13->field_2 + 8);
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar15->_M_allocated_capacity;
        internal_flag.field_2._8_8_ = pcVar19;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&internal_flag.field_2 + 8),(pTVar4->name_)._M_dataplus._M_p);
      ignore_sigprof_action.sa_restorer = (_func_void *)&filter_flag._M_string_length;
      p_Var7 = (_func_void *)(pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p_Var7 == paVar15) {
        filter_flag._M_string_length = paVar15->_M_allocated_capacity;
        filter_flag.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar13->field_2 + 8);
      }
      else {
        filter_flag._M_string_length = paVar15->_M_allocated_capacity;
        ignore_sigprof_action.sa_restorer = p_Var7;
      }
      filter_flag._M_dataplus._M_p = (pointer)pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_310.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_310.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar18) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar17) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pipe_fd = (int  [2])&local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"--","");
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       "gtest_");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar13->_M_dataplus)._M_p;
      paVar16 = &pbVar13->field_2;
      if (paVar15 == paVar16) {
        local_f0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      }
      else {
        local_f0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_f0._M_dataplus._M_p = (pointer)paVar15;
      }
      local_f0._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_f0,"internal_run_death_test");
      local_110._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == paVar15) {
        local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_110._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_110,"=");
      local_d0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar15) {
        local_d0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_d0._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_d0,this->file_);
      local_70._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar15) {
        local_70.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_70._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_70.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_70._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_70,"|");
      local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar15) {
        local_50.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_50._M_dataplus._M_p = (pointer)paVar18;
      }
      else {
        local_50.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      }
      local_50._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      StreamableToString<int>((string *)auStack_158,&this->line_);
      uVar24 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar18) {
        uVar24 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 <
          (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start + local_50._M_string_length)) {
        ppcVar20 = (pointer)0xf;
        if ((pointer *)_auStack_158 !=
            &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          ppcVar20 = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        if (ppcVar20 <
            (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start + local_50._M_string_length))
        goto LAB_00144cad;
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          auStack_158,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
      }
      else {
LAB_00144cad:
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_50,_auStack_158,
                            (size_type)
                            args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if (paVar16 == paVar15) {
        local_90.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      }
      else {
        local_90.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_90._M_dataplus._M_p = (pointer)paVar16;
      }
      local_90._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      paVar15->_M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_90,"|");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar13->_M_dataplus)._M_p;
      paVar16 = &pbVar13->field_2;
      if (paVar15 == paVar16) {
        local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_b0._M_dataplus._M_p = (pointer)paVar15;
      }
      local_b0._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      StreamableToString<int>((string *)local_180,&local_15c);
      uVar2 = CONCAT44(args_2.argv._4_4_,(int)args_2.argv) + local_b0._M_string_length;
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar24 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < uVar2) {
        uVar21 = 0xf;
        if (local_180 != (undefined1  [8])&args_2.close_fd) {
          uVar21 = args_2._8_8_;
        }
        if (uVar21 < uVar2) goto LAB_00144de2;
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_180,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      }
      else {
LAB_00144de2:
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_b0,(char *)local_180,CONCAT44(args_2.argv._4_4_,(int)args_2.argv)
                           );
      }
      local_310.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      _Var6.sa_handler = (__sighandler_t)(pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6.sa_handler == paVar15) {
        ignore_sigprof_action.sa_mask.__val[0] = paVar15->_M_allocated_capacity;
        ignore_sigprof_action.sa_mask.__val[1] = *(unsigned_long *)((long)&pbVar13->field_2 + 8);
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = paVar15->_M_allocated_capacity;
        local_310.sa_handler = _Var6.sa_handler;
      }
      ignore_sigprof_action.__sigaction_handler =
           (anon_union_8_2_5ad2d23e_for___sigaction_handler)pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      paVar15->_M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_310,"|");
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      pcVar19 = (pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar19 == paVar15) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar15->_M_allocated_capacity;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)((long)&pbVar13->field_2 + 8);
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar15->_M_allocated_capacity;
        internal_flag.field_2._8_8_ = pcVar19;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      StreamableToString<int>((string *)((long)&filter_flag.field_2 + 8),&local_134);
      pbVar3 = (pointer)((long)&((args_1.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        local_250);
      pbVar22 = (pointer)0xf;
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar22 = args_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (pbVar22 < pbVar3) {
        uVar24 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_) != &local_248) {
          uVar24 = local_248._M_allocated_capacity;
        }
        if ((ulong)uVar24 < pbVar3) goto LAB_00144f23;
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&filter_flag.field_2 + 8),0,0,(char *)internal_flag.field_2._8_8_,
                          (size_type)
                          args_1.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
LAB_00144f23:
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&internal_flag.field_2 + 8),
                            (char *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_),
                            local_250);
      }
      local_238 = &internal_flag._M_string_length;
      psVar8 = (size_type *)(pbVar13->_M_dataplus)._M_p;
      paVar15 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8 == paVar15) {
        internal_flag._M_string_length = paVar15->_M_allocated_capacity;
        internal_flag.field_2._M_allocated_capacity = *(size_type *)((long)&pbVar13->field_2 + 8);
      }
      else {
        internal_flag._M_string_length = paVar15->_M_allocated_capacity;
        local_238 = psVar8;
      }
      internal_flag._M_dataplus._M_p = (pointer)pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar13->_M_string_length = 0;
      paVar15->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_) != &local_248) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_),
                        (ulong)(local_248._M_allocated_capacity + 1));
      }
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_310.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_310.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if (local_180 != (undefined1  [8])&args_2.close_fd) {
        operator_delete((void *)local_180,args_2._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((pointer *)_auStack_158 !=
          &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete(_auStack_158,
                        (long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                              .super__Vector_impl_data._M_finish + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar18) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar17) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (pipe_fd != (int  [2])&local_120) {
        operator_delete((void *)pipe_fd,local_120._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)auStack_158);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&internal_flag.field_2 + 8),__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)auStack_158,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&internal_flag.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&internal_flag.field_2 + 8));
      __position._M_current =
           args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      internal_flag.field_2._8_8_ = strdup((char *)ignore_sigprof_action.sa_restorer);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,__position,
                 (value_type *)((long)&internal_flag.field_2 + 8));
      ppbVar1 = &args_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      internal_flag.field_2._8_8_ = strdup((char *)local_238);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,
                 (const_iterator)
                 (args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1),
                 (value_type *)((long)&internal_flag.field_2 + 8));
      internal_flag.field_2._8_8_ = ppbVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&internal_flag.field_2 + 8),"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &DeathTest::last_death_test_message__abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&internal_flag.field_2 + 8));
      if ((pointer *)internal_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_180 = (undefined1  [8])_auStack_158;
      args_2.argv._0_4_ = local_138;
      memset(&local_310,0,0x98);
      sigemptyset((sigset_t *)&ignore_sigprof_action);
      local_310 = (_union_1457)0x1;
      do {
        iVar10 = sigaction(0x1b,(sigaction *)&local_310,
                           (sigaction *)((long)&internal_flag.field_2 + 8));
        cVar9 = FLAGS_gtest_death_test_use_fork;
        if (iVar10 != -1) {
          iVar10 = -1;
          if (FLAGS_gtest_death_test_use_fork == '\0') {
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
              AssumeRole();
            }
            uVar11 = getpagesize();
            __len = (size_t)(int)uVar11;
            __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
            if (__addr == (void *)0xffffffffffffffff) {
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_110,"CHECK failed: File ","");
              pbVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&local_110,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                                  );
              local_d0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
              paVar17 = &pbVar13->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p == paVar17) {
                local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
                local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              }
              else {
                local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
              }
              local_d0._M_string_length = pbVar13->_M_string_length;
              (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
              pbVar13->_M_string_length = 0;
              (pbVar13->field_2)._M_local_buf[0] = '\0';
              pbVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&local_d0,", line ");
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar13->_M_dataplus)._M_p;
              paVar18 = &pbVar13->field_2;
              if (paVar17 != paVar18) goto LAB_001463fd;
              local_70.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
              goto LAB_00146408;
            }
            lVar23 = 0;
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
              lVar23 = __len - 0x40;
            }
            if ((0x40 < uVar11) && (((ulong)(lVar23 + (long)__addr) & 0x3f) == 0)) {
              iVar10 = clone(ExecDeathTestChildMain,(void *)(lVar23 + (long)__addr),0x11,local_180);
              iVar12 = munmap(__addr,__len);
              if (iVar12 != -1) goto LAB_001453bd;
              goto LAB_00145a9d;
            }
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,"CHECK failed: File ","");
            pbVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_110,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                                );
            local_d0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
            paVar17 = &pbVar13->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p == paVar17) {
              local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            }
            local_d0._M_string_length = pbVar13->_M_string_length;
            (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar13->_M_string_length = 0;
            (pbVar13->field_2)._M_local_buf[0] = '\0';
            pbVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_d0,", line ");
            local_70._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
            paVar17 = &pbVar13->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p == paVar17) {
              local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            }
            else {
              local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            }
            local_70._M_string_length = pbVar13->_M_string_length;
            (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar13->_M_string_length = 0;
            (pbVar13->field_2)._M_local_buf[0] = '\0';
            pipe_fd[0] = 0x442;
            StreamableToString<int>(&local_f0,pipe_fd);
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              uVar24 = local_70.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < local_f0._M_string_length + local_70._M_string_length) {
              uVar24 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                uVar24 = local_f0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar24 < local_f0._M_string_length + local_70._M_string_length)
              goto LAB_00146526;
              pbVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                  (&local_f0,0,0,local_70._M_dataplus._M_p,local_70._M_string_length
                                  );
            }
            else {
LAB_00146526:
              pbVar13 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                  (&local_70,local_f0._M_dataplus._M_p,local_f0._M_string_length);
            }
            local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
            paVar17 = &pbVar13->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == paVar17) {
              local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            }
            else {
              local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            }
            local_50._M_string_length = pbVar13->_M_string_length;
            (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar13->_M_string_length = 0;
            paVar17->_M_local_buf[0] = '\0';
            pbVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_50,": ");
            local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
            paVar17 = &pbVar13->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p == paVar17) {
              local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            }
            else {
              local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            }
            local_90._M_string_length = pbVar13->_M_string_length;
            (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
            pbVar13->_M_string_length = 0;
            (pbVar13->field_2)._M_local_buf[0] = '\0';
            pbVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_90,
                                 "stack_size > kMaxStackAlignment && reinterpret_cast<intptr_t>(stack_top) % kMaxStackAlignment == 0"
                                );
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(pbVar13->_M_dataplus)._M_p;
            paVar18 = &pbVar13->field_2;
            if (paVar17 != paVar18) goto LAB_00146cb6;
            local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
            local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            goto LAB_00146cc7;
          }
LAB_001453bd:
          if ((cVar9 == '\0') || (iVar10 = fork(), iVar10 != 0)) {
            goto LAB_001453d9;
          }
          ExecDeathTestChildMain(local_180);
LAB_00145a9d:
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"CHECK failed: File ","");
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_110,
                             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                            );
          local_d0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar17 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p == paVar17) {
            local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          }
          local_d0._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_d0,", line ");
          local_70._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar17 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == paVar17) {
            local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          }
          local_70._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          pipe_fd[0] = 0x446;
          StreamableToString<int>(&local_f0,pipe_fd);
          uVar24 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            uVar24 = local_70.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar24 < local_f0._M_string_length + local_70._M_string_length) {
            uVar24 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              uVar24 = local_f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar24 < local_f0._M_string_length + local_70._M_string_length)
            goto LAB_001465c5;
            pbVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_f0,0,0,local_70._M_dataplus._M_p,local_70._M_string_length);
          }
          else {
LAB_001465c5:
            pbVar13 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_70,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          }
          local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar17 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p == paVar17) {
            local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          }
          else {
            local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          }
          local_50._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar13->_M_string_length = 0;
          paVar17->_M_local_buf[0] = '\0';
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_50,": ");
          local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar17 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p == paVar17) {
            local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          }
          local_90._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_90,"munmap(stack, stack_size) != -1");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar13->_M_dataplus)._M_p;
          paVar18 = &pbVar13->field_2;
          if (paVar17 != paVar18) goto LAB_00146cea;
          local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
          goto LAB_00146cfb;
        }
        piVar14 = __errno_location();
      } while (*piVar14 == 4);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                      );
      local_110._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar18 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p == paVar18) {
        local_110.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_110._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_110,", line ");
      local_d0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar18 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar18) {
        local_d0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_d0._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      filter_flag.field_2._8_4_ = 0x429;
      StreamableToString<int>((string *)pipe_fd,(int *)(filter_flag.field_2._M_local_buf + 8));
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar24 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_128 + local_d0._M_string_length) {
        uVar24 = 0xf;
        if (pipe_fd != (int  [2])&local_120) {
          uVar24 = local_120._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_128 + local_d0._M_string_length) goto LAB_0014572f;
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          pipe_fd,0,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      }
      else {
LAB_0014572f:
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_d0,(char *)pipe_fd,local_128);
      }
      local_70._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar18 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar18) {
        local_70.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_70._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_70.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_70._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar13->_M_string_length = 0;
      paVar18->_M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_70,": ");
      local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar17 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar17) {
        local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      }
      local_50._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_50,
                       "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)");
      local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar17 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar17) {
        local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      }
      local_90._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_90," != -1");
      local_b0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar18 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar18) {
        local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_b0._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_b0);
      pbVar13 = extraout_RAX;
      paVar17 = extraout_RDX;
      goto LAB_00146395;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_70,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                    );
    local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar17) {
      local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    local_50._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_50,", line ");
    local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar17) {
      local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p._0_4_ = 0x46e;
    StreamableToString<int>(&local_d0,(int *)&local_110);
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar24 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_d0._M_string_length + local_90._M_string_length) {
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar24 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_d0._M_string_length + local_90._M_string_length) goto LAB_0014617b;
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_d0,0,0,local_90._M_dataplus._M_p,local_90._M_string_length);
    }
    else {
LAB_0014617b:
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append(&local_90,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    }
    local_b0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar17) {
      local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    local_b0._M_string_length = pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    paVar17->_M_local_buf[0] = '\0';
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_b0,": ");
    local_310.sa_handler = (__sighandler_t)(pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.sa_handler == paVar17) {
      ignore_sigprof_action.sa_mask.__val[0] = paVar17->_M_allocated_capacity;
      ignore_sigprof_action.sa_mask.__val[1] = *(unsigned_long *)((long)&pbVar13->field_2 + 8);
      local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = paVar17->_M_allocated_capacity;
    }
    ignore_sigprof_action.__sigaction_handler =
         (anon_union_8_2_5ad2d23e_for___sigaction_handler)pbVar13->_M_string_length;
    (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar13->_M_string_length = 0;
    (pbVar13->field_2)._M_local_buf[0] = '\0';
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_310
                     ,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    internal_flag.field_2._8_8_ = (pbVar13->_M_dataplus)._M_p;
    paVar17 = &pbVar13->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)internal_flag.field_2._8_8_ != paVar17) goto LAB_00146ad9;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar17->_M_allocated_capacity;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&pbVar13->field_2 + 8);
    internal_flag.field_2._8_8_ =
         &args_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  }
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
  pbVar13 = extraout_RAX_03;
  local_90._M_dataplus._M_p = (pointer)extraout_RDX_03;
  goto LAB_00146b0d;
LAB_0014546b:
  do {
    iVar12 = close(local_134);
    if (iVar12 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar10;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_138;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)auStack_158);
      if (local_238 != &internal_flag._M_string_length) {
        operator_delete(local_238,internal_flag._M_string_length + 1);
      }
      if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
        operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
      }
      return OVERSEE_TEST;
    }
    piVar14 = __errno_location();
  } while (*piVar14 == 4);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_d0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                      );
  local_70._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar17) {
    local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_70,", line ");
  local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar17) {
    local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p._0_4_ = 0x485;
  StreamableToString<int>(&local_110,(int *)&local_f0);
  uVar24 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    uVar24 = local_50.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar24 < (pointer)(local_110._M_string_length + local_50._M_string_length)) {
    uVar24 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar24 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < (pointer)(local_110._M_string_length + local_50._M_string_length))
    goto LAB_00145888;
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_110,0,0,local_50._M_dataplus._M_p,local_50._M_string_length);
  }
  else {
LAB_00145888:
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_50,local_110._M_dataplus._M_p,local_110._M_string_length);
  }
  local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar17) {
    local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  paVar17->_M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_90,": ");
  local_b0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar17) {
    local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_b0,"close(pipe_fd[1])");
  local_310.sa_handler = (__sighandler_t)(pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310.sa_handler == paVar17) {
    ignore_sigprof_action.sa_mask.__val[0] = paVar17->_M_allocated_capacity;
    ignore_sigprof_action.sa_mask.__val[1] = *(unsigned_long *)((long)&pbVar13->field_2 + 8);
    local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
  }
  else {
    ignore_sigprof_action.sa_mask.__val[0] = paVar17->_M_allocated_capacity;
  }
  ignore_sigprof_action.__sigaction_handler =
       (anon_union_8_2_5ad2d23e_for___sigaction_handler)pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_310," != -1");
  internal_flag.field_2._8_8_ =
       &args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  pcVar19 = (pbVar13->_M_dataplus)._M_p;
  paVar18 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar19 != paVar18) goto LAB_001463c9;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar18->_M_allocated_capacity;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)((long)&pbVar13->field_2 + 8);
  goto LAB_001463da;
  while (piVar14 = __errno_location(), *piVar14 == 4) {
LAB_001453d9:
    iVar12 = sigaction(0x1b,(sigaction *)((long)&internal_flag.field_2 + 8),(sigaction *)0x0);
    if (iVar12 != -1) {
      if (iVar10 != -1) goto LAB_0014546b;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","")
      ;
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_110,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                      );
      local_d0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar17 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar17) {
        local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      }
      local_d0._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_d0,", line ");
      local_70._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar17 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar17) {
        local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      }
      local_70._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pipe_fd[0] = 0x456;
      StreamableToString<int>(&local_f0,pipe_fd);
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar24 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar24 < local_f0._M_string_length + local_70._M_string_length) {
        uVar24 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          uVar24 = local_f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar24 < local_f0._M_string_length + local_70._M_string_length)
        goto LAB_0014634c;
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace(&local_f0,0,0,local_70._M_dataplus._M_p,local_70._M_string_length);
      }
      else {
LAB_0014634c:
        pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_70,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      }
      local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar17 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == paVar17) {
        local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      }
      else {
        local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      }
      local_50._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
      pbVar13->_M_string_length = 0;
      paVar17->_M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_50,": ");
      local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar17 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar17) {
        local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      }
      local_90._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_90,"child_pid != -1");
      local_b0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
      paVar18 = &pbVar13->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar18) {
        local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
      }
      local_b0._M_string_length = pbVar13->_M_string_length;
      (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar13->_M_string_length = 0;
      (pbVar13->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_b0);
      pbVar13 = extraout_RAX_04;
      local_b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_00146c82;
    }
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                      );
  local_110._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p == paVar17) {
    local_110.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_110._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_110,", line ");
  local_d0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar17) {
    local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_d0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  filter_flag.field_2._8_4_ = 0x453;
  StreamableToString<int>((string *)pipe_fd,(int *)(filter_flag.field_2._M_local_buf + 8));
  uVar24 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar24 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar24 < local_128 + local_d0._M_string_length) {
    uVar24 = 0xf;
    if (pipe_fd != (int  [2])&local_120) {
      uVar24 = local_120._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_128 + local_d0._M_string_length) goto LAB_001457e6;
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,0
                      ,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  }
  else {
LAB_001457e6:
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_d0,(char *)pipe_fd,local_128);
  }
  local_70._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar17) {
    local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  paVar17->_M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_70,": ");
  local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar17) {
    local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_50,"sigaction(SIGPROF, &saved_sigprof_action, NULL)");
  local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar17) {
    local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_90," != -1");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar13->_M_dataplus)._M_p;
  paVar18 = &pbVar13->field_2;
  if (paVar17 == paVar18) {
    local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
  }
  else {
LAB_00146395:
    local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_b0._M_dataplus._M_p = (pointer)paVar17;
  }
  local_b0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_b0);
  pbVar13 = extraout_RAX_00;
  pcVar19 = extraout_RDX_00;
LAB_001463c9:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar18->_M_allocated_capacity;
  internal_flag.field_2._8_8_ = pcVar19;
LAB_001463da:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
  pbVar13 = extraout_RAX_01;
  paVar17 = extraout_RDX_01;
LAB_001463fd:
  local_70.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
  local_70._M_dataplus._M_p = (pointer)paVar17;
LAB_00146408:
  local_70._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pipe_fd[0] = 0x435;
  StreamableToString<int>(&local_f0,pipe_fd);
  uVar24 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    uVar24 = local_70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar24 < local_f0._M_string_length + local_70._M_string_length) {
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar24 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_f0._M_string_length + local_70._M_string_length) goto LAB_00146487;
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_f0,0,0,local_70._M_dataplus._M_p,local_70._M_string_length);
  }
  else {
LAB_00146487:
    pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_70,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  }
  local_50._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar17) {
    local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_50._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  paVar17->_M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_50,": ");
  local_90._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar17 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar17) {
    local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
LAB_00146b0d:
    local_90.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar17;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_90,"stack != MAP_FAILED");
  local_b0._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
  paVar18 = &pbVar13->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar18) {
    local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
LAB_00146c82:
    local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_b0);
  pbVar13 = extraout_RAX_05;
  paVar17 = extraout_RDX_05;
LAB_00146cb6:
  local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
  local_b0._M_dataplus._M_p = (pointer)paVar17;
LAB_00146cc7:
  local_b0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_b0);
  pbVar13 = extraout_RAX_06;
  paVar17 = extraout_RDX_06;
LAB_00146cea:
  local_b0.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
  local_b0._M_dataplus._M_p = (pointer)paVar17;
LAB_00146cfb:
  local_b0._M_string_length = pbVar13->_M_string_length;
  (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar13->_M_string_length = 0;
  (pbVar13->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)auStack_158);
  if (local_238 != &internal_flag._M_string_length) {
    operator_delete(local_238,internal_flag._M_string_length + 1);
  }
  if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
    operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}